

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void detachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  long lVar1;
  int iVar2;
  sqlite3 *db_00;
  long in_FS_OFFSET;
  Db *local_d0;
  Db *pDb;
  int i;
  sqlite3 *db;
  char *zName;
  sqlite3_value **argv_local;
  int NotUsed_local;
  sqlite3_context *context_local;
  char zErr [128];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  db = (sqlite3 *)sqlite3_value_text(*argv);
  db_00 = sqlite3_context_db_handle(context);
  local_d0 = (Db *)0x0;
  if (db == (sqlite3 *)0x0) {
    db = (sqlite3 *)0x1c2056;
  }
  pDb._4_4_ = 0;
  while ((pDb._4_4_ < db_00->nDb &&
         ((local_d0 = db_00->aDb + pDb._4_4_, local_d0->pBt == (Btree *)0x0 ||
          (iVar2 = sqlite3StrICmp(local_d0->zDbSName,(char *)db), iVar2 != 0))))) {
    pDb._4_4_ = pDb._4_4_ + 1;
  }
  if (pDb._4_4_ < db_00->nDb) {
    if (pDb._4_4_ < 2) {
      sqlite3_snprintf(0x80,(char *)&context_local,"cannot detach database %s",db);
    }
    else if (db_00->autoCommit == '\0') {
      sqlite3_snprintf(0x80,(char *)&context_local,"cannot DETACH database within transaction");
    }
    else {
      iVar2 = sqlite3BtreeIsInReadTrans(local_d0->pBt);
      if ((iVar2 == 0) && (iVar2 = sqlite3BtreeIsInBackup(local_d0->pBt), iVar2 == 0)) {
        sqlite3BtreeClose(local_d0->pBt);
        local_d0->pBt = (Btree *)0x0;
        local_d0->pSchema = (Schema *)0x0;
        sqlite3CollapseDatabaseArray(db_00);
        goto LAB_001b0ed8;
      }
      sqlite3_snprintf(0x80,(char *)&context_local,"database %s is locked",db);
    }
  }
  else {
    sqlite3_snprintf(0x80,(char *)&context_local,"no such database: %s",db);
  }
  sqlite3_result_error(context,(char *)&context_local,-1);
LAB_001b0ed8:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void detachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  const char *zName = (const char *)sqlite3_value_text(argv[0]);
  sqlite3 *db = sqlite3_context_db_handle(context);
  int i;
  Db *pDb = 0;
  char zErr[128];

  UNUSED_PARAMETER(NotUsed);

  if( zName==0 ) zName = "";
  for(i=0; i<db->nDb; i++){
    pDb = &db->aDb[i];
    if( pDb->pBt==0 ) continue;
    if( sqlite3StrICmp(pDb->zDbSName, zName)==0 ) break;
  }

  if( i>=db->nDb ){
    sqlite3_snprintf(sizeof(zErr),zErr, "no such database: %s", zName);
    goto detach_error;
  }
  if( i<2 ){
    sqlite3_snprintf(sizeof(zErr),zErr, "cannot detach database %s", zName);
    goto detach_error;
  }
  if( !db->autoCommit ){
    sqlite3_snprintf(sizeof(zErr), zErr,
                     "cannot DETACH database within transaction");
    goto detach_error;
  }
  if( sqlite3BtreeIsInReadTrans(pDb->pBt) || sqlite3BtreeIsInBackup(pDb->pBt) ){
    sqlite3_snprintf(sizeof(zErr),zErr, "database %s is locked", zName);
    goto detach_error;
  }

  sqlite3BtreeClose(pDb->pBt);
  pDb->pBt = 0;
  pDb->pSchema = 0;
  sqlite3CollapseDatabaseArray(db);
  return;

detach_error:
  sqlite3_result_error(context, zErr, -1);
}